

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

uint ParseToken(wchar_t **s,size_t count,wchar_t **token,uint *token_rc,uint token_not_found_rc)

{
  bool bVar1;
  int element_count1;
  ulong uStack_40;
  int len;
  size_t i;
  uint token_not_found_rc_local;
  uint *token_rc_local;
  wchar_t **token_local;
  size_t count_local;
  wchar_t **s_local;
  
  bVar1 = IsAtoZ(*s);
  if (bVar1) {
    for (uStack_40 = 0; uStack_40 < count; uStack_40 = uStack_40 + 1) {
      element_count1 = ON_wString::Length(token[uStack_40]);
      bVar1 = ON_wString::EqualOrdinal(token[uStack_40],element_count1,*s,element_count1,true);
      if (bVar1) {
        *s = *s + element_count1;
        return token_rc[uStack_40];
      }
    }
  }
  return token_not_found_rc;
}

Assistant:

static const unsigned int ParseToken(
  const wchar_t*& s,
  size_t count,
  const wchar_t*const* token,
  const unsigned int* token_rc,
  unsigned int token_not_found_rc
  )
{
  if (IsAtoZ(s))
  {
    for (size_t i = 0; i < count; i++)
    {
      const int len = (int)ON_wString::Length(token[i]);
      if (ON_wString::EqualOrdinal(token[i], len, s, len, true))
      {
        s += len;
        return token_rc[i];
      }
    }
  }
  return token_not_found_rc;
}